

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::returnFromLexicographicOptimization
          (Highs *this,HighsStatus return_status,HighsInt original_lp_num_row)

{
  HighsInfo *info_00;
  HighsModelStatus HVar1;
  HighsInfo info;
  value_type_conflict1 local_f0;
  HighsInfo local_e8;
  
  HVar1 = this->model_status_;
  info_00 = &this->info_;
  HighsInfo::HighsInfo(&local_e8,info_00);
  if (1 < (int)((ulong)((long)(this->multi_linear_objective_).
                              super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->multi_linear_objective_).
                             super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    deleteRows(this,original_lp_num_row,(this->model_).lp_.num_row_ + -1);
    this->model_status_ = HVar1;
    if (&local_e8 != info_00) {
      if ((int)((ulong)((long)(this->info_).records.
                              super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->info_).records.
                             super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3) == 0) {
        HighsInfo::initRecords(info_00);
      }
      memcpy(&(this->info_).super_HighsInfoStruct,&local_e8.super_HighsInfoStruct,0x98);
    }
    (this->info_).super_HighsInfoStruct.dual_solution_status = 0;
    (this->info_).super_HighsInfoStruct.basis_validity = 0;
    (this->info_).super_HighsInfoStruct.objective_function_value = 0.0;
    (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = -1;
    (this->info_).super_HighsInfoStruct.max_dual_infeasibility = INFINITY;
    (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities = INFINITY;
    (this->info_).super_HighsInfoStruct.max_complementarity_violation = INFINITY;
    (this->info_).super_HighsInfoStruct.sum_complementarity_violations = INFINITY;
    (this->solution_).value_valid = true;
    local_f0 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&(this->model_).lp_.col_cost_,(long)(this->model_).lp_.num_col_,&local_f0);
  }
  HighsInfo::~HighsInfo(&local_e8);
  return return_status;
}

Assistant:

HighsStatus Highs::returnFromLexicographicOptimization(
    HighsStatus return_status, HighsInt original_lp_num_row) {
  // Save model_status_ and info_ since they are cleared by calling
  // deleteRows
  HighsModelStatus model_status = this->model_status_;
  HighsInfo info = this->info_;
  HighsInt num_linear_objective = this->multi_linear_objective_.size();
  if (num_linear_objective > 1) {
    this->deleteRows(original_lp_num_row, this->model_.lp_.num_row_ - 1);
    // Recover model_status_ and info_, and then account for lack of basis or
    // dual solution
    this->model_status_ = model_status;
    this->info_ = info;
    info_.objective_function_value = 0;
    info_.basis_validity = kBasisValidityInvalid;
    info_.dual_solution_status = kSolutionStatusNone;
    info_.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
    info_.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
    info_.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
    info_.max_complementarity_violation = kHighsIllegalComplementarityViolation;
    info_.sum_complementarity_violations =
        kHighsIllegalComplementarityViolation;
    this->solution_.value_valid = true;
    this->model_.lp_.col_cost_.assign(this->model_.lp_.num_col_, 0);
  }
  return return_status;
}